

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load(info *this,istream *is,entry_types entries,codepage_id force_codepage)

{
  bool bVar1;
  _Base_bitset<1UL> _Var2;
  logger *this_00;
  undefined8 *puVar3;
  ostream *os;
  runtime_error *this_01;
  byte bVar4;
  entry_types entries_local;
  string local_1e0 [32];
  ostringstream oss;
  ostringstream local_1b8 [392];
  
  entries_local = entries;
  version::load(&this->version,is);
  bVar4 = (this->version).known;
  if ((bool)bVar4 == false) {
    _Var2._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&
                                   (&entries_local,NoUnknownVersion);
    if ((_Base_bitset<1UL>)_Var2._M_w != (_Base_bitset<1UL>)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      os = std::operator<<((ostream *)&oss,"Unexpected setup data version: ");
      setup::operator<<(os,&this->version);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,local_1e0);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _oss = Warning;
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    std::operator<<((ostream *)local_1b8,"Unexpected setup data version: ");
    this_00 = logger::operator<<((logger *)&oss,(shell_command *)&color::white);
    setup::operator<<((ostream *)&this_00->buffer,&this->version);
    logger::operator<<(this_00,(shell_command *)&color::reset);
    logger::~logger((logger *)&oss);
    bVar4 = (this->version).known;
  }
  if ((bVar4 & 1) != 0) {
    version::is_ambiguous(&this->version);
  }
  bVar1 = version::is_ambiguous(&this->version);
  if (bVar1) {
    flags<setup::info::entry_types_Enum_,_21UL>::operator|=(&entries_local,NoSkip);
  }
  std::istream::tellg();
  warning_suppressor::warning_suppressor((warning_suppressor *)&oss);
  try_load(this,is,entries_local,force_codepage);
  bVar1 = warning_suppressor::operator_cast_to_bool((warning_suppressor *)&oss);
  if (bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::__cxx11::ostringstream::~ostringstream;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  warning_suppressor::flush((warning_suppressor *)&oss);
  warning_suppressor::~warning_suppressor((warning_suppressor *)&oss);
  return;
}

Assistant:

void info::load(std::istream & is, entry_types entries, util::codepage_id force_codepage) {
	
	version.load(is);
	
	if(!version.known) {
		if(entries & NoUnknownVersion) {
			std::ostringstream oss;
			oss << "Unexpected setup data version: " << version;
			throw std::runtime_error(oss.str());
		}
		log_warning << "Unexpected setup data version: "
		            << color::white << version << color::reset;
	}
	
	version_constant listed_version = version.value;
	
	// Some setup versions didn't increment the data version number when they should have.
	// To work around this, we try to parse the headers for all data versions and use the first
	// version that parses without warnings or errors.
	bool ambiguous = !version.known || version.is_ambiguous();
	if(version.is_ambiguous()) {
		// Force parsing all headers so that we don't miss any errors.
		entries |= NoSkip;
	}
	
	bool parsed_without_errors = false;
	std::streampos start = is.tellg();
	for(;;) {
		
		warning_suppressor warnings;
		
		try {
			
			// Try to parse headers for this version
			try_load(is, entries, force_codepage);
			
			if(warnings) {
				// Parsed without errors but with warnings - try other versions first
				if(!parsed_without_errors) {
					listed_version = version.value;
					parsed_without_errors = true;
				}
				throw std::exception();
			}
			
			warnings.flush();
			return;
			
		} catch(...) {
			
			is.clear();
			is.seekg(start);
			
			version_constant next_version = version.next();
			
			if(!ambiguous || !next_version) {
				if(version.value != listed_version) {
					// Rewind to a previous version that had better results and report those
					version.value = listed_version;
					warnings.restore();
					try_load(is, entries, force_codepage);
				} else {
					// Otherwise. report results for the current version
					warnings.flush();
					if(!parsed_without_errors) {
						throw;
					}
				}
				return;
			}
			
			// Retry with the next version
			version.value = next_version;
			ambiguous = version.is_ambiguous();
			
		}
		
	}
	
}